

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
kaitai::validation_expr_error<unsigned_short>::validation_expr_error
          (validation_expr_error<unsigned_short> *this,unsigned_short *actual,kstream *io,
          string *src_path)

{
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"not matching the expression",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)src_path);
  validation_failed_error::validation_failed_error
            (&this->super_validation_failed_error,&local_40,io,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&(this->super_validation_failed_error).super_kstruct_error =
       &PTR__kstruct_error_00280a40;
  this->m_actual = actual;
  return;
}

Assistant:

validation_expr_error<T>(const T& actual, kstream* io, const std::string src_path):
        validation_failed_error("not matching the expression", io, src_path),
        m_actual(actual)
    {
    }